

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O3

bool bsim::signed_gt(quad_value_bit_vector *a,quad_value_bit_vector *b)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  byte bVar5;
  uint in_ECX;
  byte *in_RDX;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar6 = (uint)b;
  if (0 < (int)uVar6) {
    if (1 < *(byte *)&(a->bits).
                      super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
      return false;
    }
    uVar7 = 1;
    do {
      uVar8 = uVar7;
      if (((ulong)b & 0xffffffff) == uVar8) break;
      uVar7 = uVar8 + 1;
    } while (*(byte *)((long)&(a->bits).
                              super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar8) < 2);
    if (uVar8 < ((ulong)b & 0xffffffff)) {
      return false;
    }
  }
  if (0 < (int)in_ECX) {
    if (1 < *in_RDX) {
      return false;
    }
    uVar7 = 1;
    do {
      uVar8 = uVar7;
      if (in_ECX == uVar8) break;
      uVar7 = uVar8 + 1;
    } while (in_RDX[uVar8] < 2);
    if (uVar8 < in_ECX) {
      return false;
    }
  }
  if (uVar6 != in_ECX) {
    __assert_fail("a.bitLength() == b.bitLength()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x388,
                  "bool bsim::signed_gt(const quad_value_bit_vector &, const quad_value_bit_vector &)"
                 );
  }
  lVar4 = (long)(int)uVar6;
  cVar1 = *(char *)(lVar4 + -1 + (long)a);
  if (cVar1 == '\x01') {
    bVar5 = in_RDX[lVar4 + -1];
    if (bVar5 == 0) {
      return false;
    }
    if (bVar5 == 3) goto LAB_0013e65d;
  }
  else {
    if (cVar1 == '\x03') goto LAB_0013e65d;
    bVar5 = in_RDX[lVar4 + -1];
  }
  if (bVar5 != 3) {
    if (bVar5 == 1 && cVar1 == '\0') {
      return true;
    }
    if ((int)uVar6 < 2) {
      return false;
    }
    uVar7 = (ulong)(uVar6 - 1);
    do {
      uVar6 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar6;
      bVar5 = *(byte *)((long)&(a->bits).
                               super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar7);
      if (bVar5 == 3) {
        __assert_fail("!a.is_high_impedance()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0xde,"bool bsim::operator>(const quad_value &, const quad_value &)");
      }
      bVar2 = in_RDX[uVar7];
      if (bVar2 == 3) {
        __assert_fail("!b.is_high_impedance()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0xdf,"bool bsim::operator>(const quad_value &, const quad_value &)");
      }
      if (1 < bVar5) {
        __assert_fail("a.is_binary()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0xe1,"bool bsim::operator>(const quad_value &, const quad_value &)");
      }
      if (1 < bVar2) {
        __assert_fail("b.is_binary()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0xe2,"bool bsim::operator>(const quad_value &, const quad_value &)");
      }
      bVar3 = 1;
      if (bVar5 >= bVar2 && bVar5 != bVar2) {
        bVar5 = 1;
        goto LAB_0013e5dd;
      }
      if (bVar5 < bVar2) {
        bVar5 = 0;
        goto LAB_0013e5dd;
      }
    } while (0 < (int)uVar6);
    bVar3 = 0;
LAB_0013e5dd:
    return (bool)(bVar3 & bVar5);
  }
LAB_0013e65d:
  __assert_fail("!a.is_high_impedance()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                ,0x101,"bool bsim::operator==(const quad_value &, const quad_value &)");
}

Assistant:

static inline bool
  signed_gt(const quad_value_bit_vector& a,
	    const quad_value_bit_vector& b) {

    if (!a.is_binary() || !b.is_binary()) {
      return false;
    }
    
    assert(a.bitLength() == b.bitLength());

    int N = a.bitLength();

    // a negative b non-negative
    if ((a.get(N - 1) == 1) && (b.get(N - 1) == 0)) {
      return false;
    }

    // b negative a non-negative
    if ((b.get(N - 1) == 1) && (a.get(N - 1) == 0)) {
      return true;
    }

    // Both negative or both non-negative
    //if ((a.get(N - 1) == 1) && (b.get(N - 1) == 1)) {

    for (int i = N - 2; i >= 0; i--) {
      if (a.get(i) > b.get(i)) {
  	return true;
      }

      if (a.get(i) < b.get(i)) {
  	return false;
      }
    }

    return false;

  }